

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_buffered_data.cpp
# Opt level: O1

void __thiscall
duckdb::BatchedBufferedData::Append(BatchedBufferedData *this,DataChunk *to_append,idx_t batch)

{
  mutex *__mutex;
  iterator *piVar1;
  _Base_ptr p_Var2;
  _Elt_pointer puVar3;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> _Var4;
  int iVar5;
  DataChunk *this_00;
  pointer pDVar6;
  Allocator *allocator;
  type other;
  idx_t iVar7;
  mapped_type *this_01;
  InternalException *this_02;
  pointer *__ptr;
  templated_unique_single_t chunk;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> local_58;
  ulong local_50;
  string local_48;
  
  local_50 = batch;
  this_00 = (DataChunk *)operator_new(0x40);
  DataChunk::DataChunk(this_00);
  local_58._M_head_impl = this_00;
  pDVar6 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *
                      )&local_58);
  allocator = Allocator::DefaultAllocator();
  DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_48,to_append);
  DataChunk::Initialize(pDVar6,allocator,(vector<duckdb::LogicalType,_true> *)&local_48,0x800);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_48);
  other = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
                    ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
                     &local_58);
  DataChunk::Copy(to_append,other,0);
  pDVar6 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *
                      )&local_58);
  iVar7 = DataChunk::GetAllocationSize(pDVar6);
  __mutex = &(this->super_BufferedData).glock;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar5 != 0) {
    ::std::__throw_system_error(iVar5);
  }
  if (this->min_batch == local_50) {
    p_Var2 = (this->buffer)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (((_Rb_tree_header *)p_Var2 != &(this->buffer)._M_t._M_impl.super__Rb_tree_header) &&
       (*(ulong *)(p_Var2 + 1) < this->min_batch)) {
      this_02 = (InternalException *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Batches remaining in buffer","");
      InternalException::InternalException(this_02,&local_48);
      __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    puVar3 = (this->read_queue).
             super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (puVar3 == (this->read_queue).
                  super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      ::std::
      deque<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
      ::
      _M_push_back_aux<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>
                ((deque<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
                  *)&this->read_queue,
                 (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
                 &local_58);
    }
    else {
      (puVar3->super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)._M_t.
      super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
      super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl = local_58._M_head_impl;
      local_58._M_head_impl = (DataChunk *)0x0;
      piVar1 = &(this->read_queue).
                super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    LOCK();
    (this->read_queue_byte_count).super___atomic_base<unsigned_long>._M_i =
         (this->read_queue_byte_count).super___atomic_base<unsigned_long>._M_i + iVar7;
    UNLOCK();
  }
  else {
    this_01 = ::std::
              map<unsigned_long,_duckdb::InProgressBatch,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>_>
              ::operator[](&this->buffer,&local_50);
    this_01->completed = false;
    LOCK();
    (this->buffer_byte_count).super___atomic_base<unsigned_long>._M_i =
         (this->buffer_byte_count).super___atomic_base<unsigned_long>._M_i + iVar7;
    UNLOCK();
    puVar3 = (this_01->chunks).
             super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (puVar3 == (this_01->chunks).
                  super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      ::std::
      deque<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
      ::
      _M_push_back_aux<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>
                ((deque<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
                  *)this_01,
                 (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
                 &local_58);
    }
    else {
      (puVar3->super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)._M_t.
      super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
      super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl = local_58._M_head_impl;
      local_58._M_head_impl = (DataChunk *)0x0;
      piVar1 = &(this_01->chunks).
                super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Var4._M_head_impl = local_58._M_head_impl;
  if (local_58._M_head_impl != (DataChunk *)0x0) {
    DataChunk::~DataChunk(local_58._M_head_impl);
    operator_delete(_Var4._M_head_impl);
  }
  return;
}

Assistant:

void BatchedBufferedData::Append(const DataChunk &to_append, idx_t batch) {
	// We should never find any chunks with a smaller batch index than the minimum

	auto chunk = make_uniq<DataChunk>();
	chunk->Initialize(Allocator::DefaultAllocator(), to_append.GetTypes());
	to_append.Copy(*chunk, 0);
	auto allocation_size = chunk->GetAllocationSize();

	lock_guard<mutex> lock(glock);
	D_ASSERT(batch >= min_batch);
	auto is_minimum = IsMinimumBatchIndex(lock, batch);
	if (is_minimum) {
		for (auto &it : buffer) {
			auto batch_index = it.first;
			if (batch_index >= min_batch) {
				break;
			}
			// There should not be any batches in the buffer that are lower or equal to the minimum batch index
			throw InternalException("Batches remaining in buffer");
		}
		read_queue.push_back(std::move(chunk));
		read_queue_byte_count += allocation_size;
	} else {
		auto &in_progress_batch = buffer[batch];
		auto &chunks = in_progress_batch.chunks;
		in_progress_batch.completed = false;
		buffer_byte_count += allocation_size;
		chunks.push_back(std::move(chunk));
	}
}